

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::convertInitializerList
          (TParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer)

{
  TType *type_00;
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  TArraySizes *pTVar9;
  TArraySizes *this_00;
  undefined4 extraout_var_02;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar10;
  size_type sVar11;
  const_reference pvVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermTyped *pTVar13;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar14;
  size_type sVar15;
  reference ppTVar16;
  undefined4 extraout_var_05;
  char *pcVar17;
  TParseContext *pTVar18;
  TSpirvType *local_468;
  TIntermNode *emulatedConstructorArguments;
  TString local_458;
  pool_allocator<char> local_430;
  TString local_428;
  TString local_400;
  pool_allocator<char> local_3d8;
  TString local_3d0;
  pool_allocator<char> local_3a8;
  TString local_3a0;
  TString local_378;
  TBasicType local_34c;
  int local_348;
  TBasicType initType;
  int i_3;
  TBasicType destType;
  TString local_338;
  pool_allocator<char> local_310;
  TString local_308;
  TString local_2e0;
  int local_2b4;
  undefined1 local_2b0 [4];
  int i_2;
  TType vectorType;
  TString local_210;
  pool_allocator<char> local_1e8;
  TString local_1e0;
  TString local_1b8;
  ulong local_190;
  size_t i_1;
  ulong local_180;
  size_t i;
  TType elementType;
  int d;
  TIntermTyped *firstInit;
  TType arrayType;
  TIntermAggregate *initList;
  TIntermTyped *initializer_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_01;
  
  iVar2 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
  arrayType.spirvType = (TSpirvType *)CONCAT44(extraout_var,iVar2);
  pTVar18 = (TParseContext *)initializer;
  if (((TIntermOperator *)arrayType.spirvType != (TIntermOperator *)0x0) &&
     (TVar3 = TIntermOperator::getOp((TIntermOperator *)arrayType.spirvType),
     pTVar18 = (TParseContext *)initializer, TVar3 == EOpNull)) {
    uVar4 = (*type->_vptr_TType[0x1d])();
    if ((uVar4 & 1) == 0) {
      uVar4 = (*type->_vptr_TType[0x25])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*type->_vptr_TType[0x1c])();
        if ((uVar4 & 1) == 0) {
          uVar4 = (*type->_vptr_TType[0x1b])();
          if ((uVar4 & 1) == 0) {
            bVar1 = TIntermediate::getEnhancedMsgs
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            pool_allocator<char>::pool_allocator(&local_430);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_428,"",&local_430);
            pool_allocator<char>::pool_allocator
                      ((pool_allocator<char> *)&emulatedConstructorArguments);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_458,"",(pool_allocator<char> *)&emulatedConstructorArguments);
            TType::getCompleteString(&local_400,type,bVar1,true,true,true,&local_428,&local_458);
            pcVar17 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(&local_400);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"unexpected initializer-list type:","initializer list",pcVar17);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_400);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_458);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_428);
            return (TIntermTyped *)(TParseContext *)0x0;
          }
          iVar2 = (*type->_vptr_TType[0xc])();
          pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                             (pvVar14);
          if (iVar2 != (int)sVar15) {
            bVar1 = TIntermediate::getEnhancedMsgs
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            pool_allocator<char>::pool_allocator(&local_310);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_308,"",&local_310);
            pool_allocator<char>::pool_allocator((pool_allocator<char> *)&i_3);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_338,"",(pool_allocator<char> *)&i_3);
            TType::getCompleteString(&local_2e0,type,bVar1,true,true,true,&local_308,&local_338);
            pcVar17 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(&local_2e0);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"wrong vector size (or rows in a matrix column):","initializer list"
                       ,pcVar17);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_2e0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_338);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_308);
            return (TIntermTyped *)(TParseContext *)0x0;
          }
          initType = (*type->_vptr_TType[7])();
          for (local_348 = 0; iVar2 = local_348, iVar5 = (*type->_vptr_TType[0xc])(), iVar2 < iVar5;
              local_348 = local_348 + 1) {
            pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                                super_allocator_type.allocator[4].alignmentMask)();
            ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar14,(long)local_348);
            iVar2 = (*(*ppTVar16)->_vptr_TIntermNode[3])();
            local_34c = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x100))();
            if ((initType != local_34c) &&
               (bVar1 = TIntermediate::canImplicitlyPromote
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,local_34c,initType,EOpNull), !bVar1)) {
              bVar1 = TIntermediate::getEnhancedMsgs
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
              pool_allocator<char>::pool_allocator(&local_3a8);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_3a0,"",&local_3a8);
              pool_allocator<char>::pool_allocator(&local_3d8);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_3d0,"",&local_3d8);
              TType::getCompleteString(&local_378,type,bVar1,true,true,true,&local_3a0,&local_3d0);
              pcVar17 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(&local_378);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"type mismatch in initializer list","initializer list",pcVar17);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_378);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_3d0);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_3a0);
              return (TIntermTyped *)(TParseContext *)0x0;
            }
          }
        }
        else {
          iVar2 = (*type->_vptr_TType[0xd])();
          pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                             (pvVar14);
          if (iVar2 != (int)sVar15) {
            bVar1 = TIntermediate::getEnhancedMsgs
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            pool_allocator<char>::pool_allocator(&local_1e8);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_1e0,"",&local_1e8);
            pool_allocator<char>::pool_allocator((pool_allocator<char> *)&vectorType.spirvType);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_210,"",(pool_allocator<char> *)&vectorType.spirvType);
            TType::getCompleteString(&local_1b8,type,bVar1,true,true,true,&local_1e0,&local_210);
            pcVar17 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(&local_1b8);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"wrong number of matrix columns:","initializer list",pcVar17);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_1b8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_210);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_1e0);
            return (TIntermTyped *)(TParseContext *)0x0;
          }
          TType::TType((TType *)local_2b0,type,0,false);
          for (local_2b4 = 0; iVar2 = local_2b4, iVar5 = (*type->_vptr_TType[0xd])(), iVar2 < iVar5;
              local_2b4 = local_2b4 + 1) {
            pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                                super_allocator_type.allocator[4].alignmentMask)();
            ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar14,(long)local_2b4);
            iVar2 = (*(*ppTVar16)->_vptr_TIntermNode[3])();
            pTVar13 = convertInitializerList
                                (this,loc,(TType *)local_2b0,
                                 (TIntermTyped *)CONCAT44(extraout_var_04,iVar2));
            pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                                super_allocator_type.allocator[4].alignmentMask)();
            ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar14,(long)local_2b4);
            *ppTVar16 = &pTVar13->super_TIntermNode;
            pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                                super_allocator_type.allocator[4].alignmentMask)();
            ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar14,(long)local_2b4);
            if (*ppTVar16 == (value_type)0x0) {
              this_local = (TParseContext *)0x0;
              i_1._4_4_ = 1;
              goto LAB_006a4bcf;
            }
          }
          i_1._4_4_ = 0;
LAB_006a4bcf:
          TType::~TType((TType *)local_2b0);
          if (i_1._4_4_ != 0) {
            return (TIntermTyped *)this_local;
          }
        }
      }
      else {
        pvVar10 = &TType::getStruct(type)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar15 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                           (pvVar10);
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        sVar11 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar14);
        if (sVar15 != sVar11) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"wrong number of structure members","initializer list","");
          return (TIntermTyped *)(TParseContext *)0x0;
        }
        local_190 = 0;
        while( true ) {
          uVar8 = local_190;
          pvVar10 = &TType::getStruct(type)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          sVar15 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                             (pvVar10);
          if (sVar15 <= uVar8) break;
          pvVar10 = &TType::getStruct(type)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                    operator[](pvVar10,local_190);
          type_00 = pvVar12->type;
          pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar14,local_190);
          iVar2 = (*(*ppTVar16)->_vptr_TIntermNode[3])();
          pTVar13 = convertInitializerList
                              (this,loc,type_00,(TIntermTyped *)CONCAT44(extraout_var_03,iVar2));
          pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar14,local_190);
          *ppTVar16 = &pTVar13->super_TIntermNode;
          pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.
                              super_allocator_type.allocator[4].alignmentMask)();
          ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar14,local_190);
          if (*ppTVar16 == (value_type)0x0) {
            return (TIntermTyped *)(TParseContext *)0x0;
          }
          local_190 = local_190 + 1;
        }
      }
      pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar14);
      if (sVar15 == 1) {
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar14,0);
        local_468 = (TSpirvType *)*ppTVar16;
      }
      else {
        local_468 = arrayType.spirvType;
      }
      pTVar18 = (TParseContext *)addConstructor(this,loc,(TIntermNode *)local_468,type);
    }
    else {
      TType::TType((TType *)&firstInit,EbtVoid,EvqTemporary,1,0,0,false);
      TType::shallowCopy((TType *)&firstInit,type);
      iVar2 = (*type->_vptr_TType[0x13])();
      TType::copyArraySizes((TType *)&firstInit,(TArraySizes *)CONCAT44(extraout_var_00,iVar2));
      pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar14);
      TType::changeOuterArraySize((TType *)&firstInit,(int)sVar15);
      pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                          allocator[4].alignmentMask)();
      ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar14,0);
      iVar2 = (*(*ppTVar16)->_vptr_TIntermNode[3])();
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar2);
      bVar1 = TType::isArrayOfArrays((TType *)&firstInit);
      if (bVar1) {
        plVar7 = (long *)(**(code **)(*plVar6 + 0xf0))();
        uVar8 = (**(code **)(*plVar7 + 0xe8))();
        if ((uVar8 & 1) != 0) {
          pTVar9 = TType::getArraySizes((TType *)&firstInit);
          iVar2 = TArraySizes::getNumDims(pTVar9);
          plVar7 = (long *)(**(code **)(*plVar6 + 0xf0))();
          pTVar9 = (TArraySizes *)(**(code **)(*plVar7 + 0x98))();
          iVar5 = TArraySizes::getNumDims(pTVar9);
          if (iVar2 == iVar5 + 1) {
            elementType.spirvType._4_4_ = 1;
            while( true ) {
              iVar2 = elementType.spirvType._4_4_;
              pTVar9 = TType::getArraySizes((TType *)&firstInit);
              iVar5 = TArraySizes::getNumDims(pTVar9);
              if (iVar5 <= iVar2) break;
              pTVar9 = TType::getArraySizes((TType *)&firstInit);
              iVar2 = TArraySizes::getDimSize(pTVar9,elementType.spirvType._4_4_);
              if (iVar2 == 0) {
                pTVar9 = TType::getArraySizes((TType *)&firstInit);
                iVar2 = elementType.spirvType._4_4_;
                plVar7 = (long *)(**(code **)(*plVar6 + 0xf0))();
                this_00 = (TArraySizes *)(**(code **)(*plVar7 + 0x98))();
                iVar5 = TArraySizes::getDimSize(this_00,elementType.spirvType._4_4_ + -1);
                TArraySizes::setDimSize(pTVar9,iVar2,iVar5);
              }
              elementType.spirvType._4_4_ = elementType.spirvType._4_4_ + 1;
            }
          }
        }
      }
      TType::TType((TType *)&i,(TType *)&firstInit,0,false);
      local_180 = 0;
      while( true ) {
        uVar8 = local_180;
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar14);
        if (sVar15 <= uVar8) break;
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar14,local_180);
        iVar2 = (*(*ppTVar16)->_vptr_TIntermNode[3])();
        pTVar13 = convertInitializerList
                            (this,loc,(TType *)&i,(TIntermTyped *)CONCAT44(extraout_var_02,iVar2));
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar14,local_180);
        *ppTVar16 = &pTVar13->super_TIntermNode;
        pvVar14 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                  (*(code *)((arrayType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator[4].alignmentMask)();
        ppTVar16 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar14,local_180);
        if (*ppTVar16 == (value_type)0x0) {
          this_local = (TParseContext *)0x0;
          goto LAB_006a477e;
        }
        local_180 = local_180 + 1;
      }
      this_local = (TParseContext *)
                   addConstructor(this,loc,(TIntermNode *)arrayType.spirvType,(TType *)&firstInit);
LAB_006a477e:
      i_1._4_4_ = 1;
      TType::~TType((TType *)&i);
      TType::~TType((TType *)&firstInit);
      pTVar18 = this_local;
    }
  }
  this_local = pTVar18;
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type, TIntermTyped* initializer)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (! initList || initList->getOp() != EOpNull)
        return initializer;

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes());  // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        arrayType.changeOuterArraySize((int)initList->getSequence().size());
        TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
        if (arrayType.isArrayOfArrays() && firstInit->getType().isArray() &&
            arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
            for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                    arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
            }
        }

        TType elementType(arrayType, 0); // dereferenced type
        for (size_t i = 0; i < initList->getSequence().size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.getMatrixCols() != (int)initList->getSequence().size()) {
            error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TType vectorType(type, 0); // dereferenced type
        for (int i = 0; i < type.getMatrixCols(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, vectorType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isVector()) {
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TBasicType destType = type.getBasicType();
        for (int i = 0; i < type.getVectorSize(); ++i) {
            TBasicType initType = initList->getSequence()[i]->getAsTyped()->getBasicType();
            if (destType != initType && !intermediate.canImplicitlyPromote(initType, destType)) {
                error(loc, "type mismatch in initializer list", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
                return nullptr;
            }

        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermNode* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0];
    else
        emulatedConstructorArguments = initList;
    return addConstructor(loc, emulatedConstructorArguments, type);
}